

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestCamelCaseFieldNames::Clear(TestCamelCaseFieldNames *this)

{
  ForeignMessage *this_00;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 aVar1;
  LogMessageFatal local_20;
  
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeatedprimitivefield_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeatedstringfield_.super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeatedenumfield_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
            (&(this->field_0)._impl_.repeatedmessagefield_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeatedstringpiecefield_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&(this->field_0)._impl_.repeatedcordfield_.super_RepeatedPtrFieldBase);
  aVar1 = this->field_0;
  if (((undefined1  [192])aVar1 & (undefined1  [192])0xf) != (undefined1  [192])0x0) {
    if (((undefined1  [192])aVar1 & (undefined1  [192])0x1) != (undefined1  [192])0x0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.stringfield_);
    }
    if (((undefined1  [192])aVar1 & (undefined1  [192])0x2) != (undefined1  [192])0x0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.stringpiecefield_);
    }
    if (((undefined1  [192])aVar1 & (undefined1  [192])0x4) != (undefined1  [192])0x0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.cordfield_);
    }
    if (((undefined1  [192])aVar1 & (undefined1  [192])0x8) != (undefined1  [192])0x0) {
      this_00 = (this->field_0)._impl_.messagefield_;
      if (this_00 == (ForeignMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
                   ,0x690b,"_impl_.messagefield_ != nullptr");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      edition_unittest::ForeignMessage::Clear(this_00);
    }
  }
  if (((undefined1  [192])aVar1 & (undefined1  [192])0x30) != (undefined1  [192])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0xb8) = 0x400000000;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestCamelCaseFieldNames::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestCamelCaseFieldNames)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeatedprimitivefield_.Clear();
  _impl_.repeatedstringfield_.Clear();
  _impl_.repeatedenumfield_.Clear();
  _impl_.repeatedmessagefield_.Clear();
  _impl_.repeatedstringpiecefield_.Clear();
  _impl_.repeatedcordfield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.stringfield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.stringpiecefield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.cordfield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.messagefield_ != nullptr);
      _impl_.messagefield_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000030u) != 0) {
    _impl_.primitivefield_ = 0;
    _impl_.enumfield_ = 4;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}